

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

size_t upb_Message_ExtensionCount(upb_Message *msg)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  size_t sVar4;
  ulong uVar5;
  uint *puVar6;
  
  if ((msg->field_0).internal_opaque < 2) {
    return 0;
  }
  puVar6 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  sVar4 = 0;
  uVar5 = 0;
LAB_002f73fe:
  uVar2 = (ulong)*puVar6;
  if (uVar2 <= uVar5) {
    return sVar4;
  }
  do {
    uVar5 = uVar5 + 1;
    if ((*(ulong *)(puVar6 + uVar5 * 2) & 1) != 0) {
      plVar3 = (long *)(*(ulong *)(puVar6 + uVar5 * 2) & 0xfffffffffffffffc);
      switch(*(byte *)(*plVar3 + 0xb) & 3) {
      case 0:
        lVar1 = plVar3[1];
        if (*(char *)(lVar1 + 3) == '\x01') {
          uVar2 = (ulong)*(uint *)(lVar1 + 0x10);
        }
        else {
          uVar2 = upb_inttable_count((upb_inttable *)(lVar1 + 8));
        }
        if (uVar2 != 0) goto switchD_002f7427_caseD_2;
        uVar2 = (ulong)*puVar6;
        break;
      case 1:
        if (*(long *)(plVar3[1] + 8) != 0) goto switchD_002f7427_caseD_2;
        break;
      case 2:
        goto switchD_002f7427_caseD_2;
      case 3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                      ,0x3f,
                      "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                     );
      }
    }
    if (uVar2 <= uVar5) {
      return sVar4;
    }
  } while( true );
switchD_002f7427_caseD_2:
  sVar4 = sVar4 + 1;
  puVar6 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  if (puVar6 == (uint *)0x0) {
    return sVar4;
  }
  goto LAB_002f73fe;
}

Assistant:

size_t upb_Message_ExtensionCount(const upb_Message* msg) {
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  if (!in) return 0;
  const upb_MiniTableExtension* ext;
  upb_MessageValue val;
  uintptr_t iter = kUpb_Message_ExtensionBegin;
  size_t count = 0;
  while (upb_Message_NextExtension(msg, &ext, &val, &iter)) {
    count++;
  }
  return count;
}